

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderTests.cpp
# Opt level: O2

void __thiscall
DecoderTestsFixture_failed_reserve_resources_Test::TestBody
          (DecoderTestsFixture_failed_reserve_resources_Test *this)

{
  MockSpec<void_*(unsigned_long)> *this_00;
  TypedExpectation<void_*(unsigned_long)> *this_01;
  char *message;
  allocator local_e9;
  AssertionResult gtest_ar;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b0;
  int local_84;
  string local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_38;
  
  testing::A<unsigned_long>();
  this_00 = ResourceSystemMock::gmock_Resource_Reserve
                      (&(this->super_DecoderTestsFixture).rs,(Matcher<unsigned_long> *)&local_b0);
  this_01 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
                       ,0x11,"rs","Resource_Reserve(_)");
  local_60.first._M_dataplus._M_p = (pointer)0x0;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_d8);
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillRepeatedly
            (this_01,(Action<void_*(unsigned_long)> *)&local_d8);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)&local_d8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b0);
  local_84 = -1;
  message = "";
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[1],_int,_true>(&local_38,(char (*) [1])0x1520ec,&local_84);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair(&local_d8,&local_38);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair(&local_b0,&local_d8);
  std::__cxx11::string::string
            ((string *)&local_80,"message which needs too much resources",&local_e9);
  Decoder::decode(&local_60,&local_80);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::string,int>>>::
  operator()(&gtest_ar,(char *)&local_b0,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)"Decoder::decode(\"message which needs too much resources\")");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(DecoderTestsFixture, failed_reserve_resources)
{
	EXPECT_CALL(rs, Resource_Reserve(_)).WillRepeatedly(Return(nullptr));

	ASSERT_THAT(Decoder::decode("message which needs too much resources"), Eq(ValueWithError("", -1)));
}